

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsync_semaphore_futex.c
# Opt level: O2

int nsync::nsync_mu_semaphore_p_with_deadline(nsync_semaphore *s,nsync_time abs_deadline)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  timespec *timeout;
  int in_R9D;
  bool bVar4;
  nsync_time nVar5;
  timespec local_40;
  
  do {
    while (iVar2 = *(int *)s->sem_space, iVar2 == 0) {
      nVar5.tv_nsec = 999999999;
      nVar5.tv_sec = 0x7fffffffffffffff;
      iVar2 = nsync_time_cmp(abs_deadline,nVar5);
      if (iVar2 == 0) {
        timeout = (timespec *)0x0;
      }
      else {
        timeout = &local_40;
        local_40.tv_sec = abs_deadline.tv_sec;
        local_40.tv_nsec = abs_deadline.tv_nsec;
      }
      iVar2 = futex((int *)s,0x189,0,timeout,(int *)0xffffffff,in_R9D);
      if (iVar2 != 0) {
        piVar3 = __errno_location();
        iVar1 = *piVar3;
        if (((iVar1 == 4) || (iVar1 == 0xb)) || (iVar1 == 0x6e)) {
          if (iVar1 == 0x6e && iVar2 == -1) {
            nVar5 = nsync_time_now();
            iVar2 = nsync_time_cmp(abs_deadline,nVar5);
            if (iVar2 < 1) {
              return 0x6e;
            }
          }
        }
        else {
          _DAT_00000000 = 0;
        }
      }
    }
    LOCK();
    bVar4 = iVar2 == *(int *)s->sem_space;
    if (bVar4) {
      *(int *)s->sem_space = iVar2 + -1;
    }
    UNLOCK();
  } while (!bVar4);
  return 0;
}

Assistant:

int nsync_mu_semaphore_p_with_deadline (nsync_semaphore *s, nsync_time abs_deadline) {
	struct futex *f = (struct futex *)s;
	int i;
	int result = 0;
	do {
		i = ATM_LOAD ((nsync_atomic_uint32_ *) &f->i);
		if (i == 0) {
			int futex_result;
			struct timespec ts_buf;
			const struct timespec *ts = NULL;
			if (nsync_time_cmp (abs_deadline, nsync_time_no_deadline) != 0) {
				memset (&ts_buf, 0, sizeof (ts_buf));
				if (FUTEX_TIMEOUT_IS_ABSOLUTE) {
					ts_buf.tv_sec = NSYNC_TIME_SEC (abs_deadline);
					ts_buf.tv_nsec = NSYNC_TIME_NSEC (abs_deadline);
				} else {
					nsync_time now;
					now = nsync_time_now ();
					if (nsync_time_cmp (now, abs_deadline) > 0) {
						ts_buf.tv_sec = 0;
						ts_buf.tv_nsec = 0;
					} else {
						nsync_time rel_deadline;
						rel_deadline = nsync_time_sub (abs_deadline, now);
						ts_buf.tv_sec = NSYNC_TIME_SEC (rel_deadline);
						ts_buf.tv_nsec = NSYNC_TIME_NSEC (rel_deadline);
					}
				}
				ts = &ts_buf;
			}
			futex_result = futex (&f->i, FUTEX_WAIT_, i, ts, NULL, FUTEX_WAIT_BITS_);
			ASSERT (futex_result == 0 || errno == EINTR || errno == EWOULDBLOCK ||
				errno == ETIMEDOUT);
			/* Some systems don't wait as long as they are told. */ 
			if (futex_result == -1 && errno == ETIMEDOUT &&
			    nsync_time_cmp (abs_deadline, nsync_time_now ()) <= 0) {
				result = ETIMEDOUT;
			}
		}
	} while (result == 0 && (i == 0 || !ATM_CAS_ACQ ((nsync_atomic_uint32_ *) &f->i, i, i - 1)));
	return (result);
}